

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlangs.c
# Opt level: O0

double zlangs(char *norm,SuperMatrix *A)

{
  double *pdVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  void *addr;
  long lVar5;
  double dVar6;
  double local_380;
  double *local_378;
  double local_370;
  int local_35c;
  char local_358 [8];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  double *rwork;
  double sum;
  double value;
  int local_30;
  int irow;
  int j;
  int i;
  doublecomplex *Aval;
  NCformat *Astore;
  SuperMatrix *A_local;
  char *norm_local;
  
  sum = 0.0;
  pvVar2 = A->Store;
  lVar3 = *(long *)((long)pvVar2 + 8);
  if (A->nrow < A->ncol) {
    local_35c = A->nrow;
  }
  else {
    local_35c = A->ncol;
  }
  if (local_35c != 0) {
    iVar4 = strncmp(norm,"M",1);
    if (iVar4 == 0) {
      for (local_30 = 0; local_30 < A->ncol; local_30 = local_30 + 1) {
        for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)local_30 * 4);
            irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(local_30 + 1) * 4);
            irow = irow + 1) {
          dVar6 = z_abs((doublecomplex *)(lVar3 + (long)irow * 0x10));
          if (sum <= dVar6) {
            local_370 = z_abs((doublecomplex *)(lVar3 + (long)irow * 0x10));
          }
          else {
            local_370 = sum;
          }
          sum = local_370;
        }
      }
    }
    else {
      iVar4 = strncmp(norm,"O",1);
      if ((iVar4 == 0) || (*norm == '1')) {
        for (local_30 = 0; local_30 < A->ncol; local_30 = local_30 + 1) {
          rwork = (double *)0x0;
          for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)local_30 * 4);
              irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(local_30 + 1) * 4);
              irow = irow + 1) {
            dVar6 = z_abs((doublecomplex *)(lVar3 + (long)irow * 0x10));
            rwork = (double *)(dVar6 + (double)rwork);
          }
          if (sum <= (double)rwork) {
            local_378 = rwork;
          }
          else {
            local_378 = (double *)sum;
          }
          sum = (double)local_378;
        }
      }
      else {
        iVar4 = strncmp(norm,"I",1);
        if (iVar4 == 0) {
          addr = superlu_malloc((long)A->nrow << 3);
          if (addr == (void *)0x0) {
            sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c"
                   );
            superlu_abort_and_exit(msg_1 + 0xf8);
          }
          for (irow = 0; irow < A->nrow; irow = irow + 1) {
            *(undefined8 *)((long)addr + (long)irow * 8) = 0;
          }
          for (local_30 = 0; local_30 < A->ncol; local_30 = local_30 + 1) {
            for (irow = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)local_30 * 4);
                irow < *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(local_30 + 1) * 4);
                irow = irow + 1) {
              iVar4 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)irow * 4);
              dVar6 = z_abs((doublecomplex *)(lVar3 + (long)irow * 0x10));
              lVar5 = (long)iVar4;
              *(double *)((long)addr + lVar5 * 8) = dVar6 + *(double *)((long)addr + lVar5 * 8);
            }
          }
          for (irow = 0; irow < A->nrow; irow = irow + 1) {
            pdVar1 = (double *)((long)addr + (long)irow * 8);
            if (sum < *pdVar1 || sum == *pdVar1) {
              local_380 = *(double *)((long)addr + (long)irow * 8);
            }
            else {
              local_380 = sum;
            }
            sum = local_380;
          }
          superlu_free(addr);
        }
        else {
          iVar4 = strncmp(norm,"F",1);
          if ((iVar4 == 0) || (iVar4 = strncmp(norm,"E",1), iVar4 == 0)) {
            sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Not implemented.",0x75,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c"
                   );
            superlu_abort_and_exit(msg_2 + 0xf8);
          }
          else {
            sprintf(local_358,"%s at line %d in file %s\n","Illegal norm specified.",0x77,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c"
                   );
            superlu_abort_and_exit(local_358);
          }
        }
      }
    }
  }
  return sum;
}

Assistant:

double zlangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int      i, j, irow;
    double   value = 0., sum;
    double   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, z_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += z_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (double *) SUPERLU_MALLOC(A->nrow * sizeof(double))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += z_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}